

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_gesture.cpp
# Opt level: O3

int Am_Gesture_Set_Old_Owner_To_Me_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object cmd;
  Am_Object item;
  Am_Value item_value;
  Am_Value_List items;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  undefined8 local_78;
  Am_Value local_70;
  Am_Value_List local_60;
  Am_Value_List local_50;
  Am_Object local_40;
  Am_Object local_38;
  
  local_90.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_50);
  pAVar2 = Am_Object::Get(self,0xc5,0);
  Am_Object::operator=(&local_90,pAVar2);
  bVar1 = Am_Object::Valid(&local_90);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(self);
    Am_Object::Set(&local_90,0x170,pAVar3,1);
  }
  pAVar2 = Am_Object::Get(self,0xa2,0);
  Am_Value_List::operator=(&local_50,pAVar2);
  Am_Value_List::Am_Value_List(&local_60,&local_50);
  Am_Object::Am_Object(&local_88,self);
  local_70.type = 0;
  local_70.value.wrapper_value = (Am_Wrapper *)0x0;
  local_78 = 0;
  local_80.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start(&local_60);
  while( true ) {
    bVar1 = Am_Value_List::Last(&local_60);
    if (bVar1) break;
    pAVar2 = Am_Value_List::Get(&local_60);
    Am_Value::operator=(&local_70,pAVar2);
    if (local_70.type == 0xa001) {
      Am_Object::Am_Object(&local_38,&local_70);
      Am_Object::operator=(&local_80,&local_38);
      Am_Object::~Am_Object(&local_38);
      Am_Object::Am_Object(&local_40,&Am_Command);
      bVar1 = Am_Object::Is_Instance_Of(&local_80,&local_40);
      Am_Object::~Am_Object(&local_40);
      if (bVar1) {
        pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_88);
        local_78 = 2;
        Am_Object::Set(&local_80,0x170,pAVar3,1);
      }
    }
    Am_Value_List::Next(&local_60);
  }
  Am_Object::~Am_Object(&local_80);
  Am_Value::~Am_Value(&local_70);
  Am_Object::~Am_Object(&local_88);
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Value_List::~Am_Value_List(&local_50);
  Am_Object::~Am_Object(&local_90);
  return (int)local_78;
}

Assistant:

Am_Define_Formula(int, Am_Gesture_Set_Old_Owner_To_Me)
{
  int ret = 0;
  Am_Object cmd;
  Am_Value_List items;
  cmd = self.Get(Am_COMMAND);
  if (cmd.Valid()) {
    cmd.Set(Am_SAVED_OLD_OWNER, self, Am_OK_IF_NOT_THERE);
    ret = 1;
  }
  items = self.Get(Am_ITEMS);
  ret = set_items_list_old_owner(items, self);

  //ret not used, different values just for debugging
  return ret;
}